

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_ecf33::ProducedDirectoryNodeTask::start
          (ProducedDirectoryNodeTask *this,TaskInterface ti)

{
  Node *pNVar1;
  Command *pCVar2;
  BuildSystemImpl *this_00;
  BuildSystemDelegate *pBVar3;
  vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_> *__x;
  void *extraout_RDX;
  TaskInterface ti_00;
  StringRef name;
  vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_> local_b0
  ;
  ProducedDirectoryNodeTask *local_98;
  void *local_90;
  StringRef local_88;
  BuildKey local_78;
  KeyType local_58;
  Command *local_38;
  Command *foundCommand;
  anon_class_16_2_e88081f0 getCommand;
  ProducedDirectoryNodeTask *this_local;
  TaskInterface ti_local;
  
  ti_local.impl = ti.ctx;
  this_local = (ProducedDirectoryNodeTask *)ti.impl;
  getCommand.this = (ProducedDirectoryNodeTask *)&this_local;
  foundCommand = (Command *)this;
  getCommand.ti = (TaskInterface *)this;
  pCVar2 = start::anon_class_16_2_e88081f0::operator()((anon_class_16_2_e88081f0 *)&foundCommand);
  local_38 = pCVar2;
  if (pCVar2 == (Command *)0x0) {
    local_98 = this_local;
    local_90 = ti_local.impl;
    ti_00.ctx = extraout_RDX;
    ti_00.impl = ti_local.impl;
    this_00 = getBuildSystem((anon_unknown_dwarf_ecf33 *)this_local,ti_00);
    pBVar3 = BuildSystemImpl::getDelegate(this_00);
    pNVar1 = this->node;
    __x = llbuild::buildsystem::Node::getProducers(this->node);
    std::vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>::
    vector(&local_b0,__x);
    (*pBVar3->_vptr_BuildSystemDelegate[0x12])(pBVar3,pNVar1,&local_b0);
    std::vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>::
    ~vector(&local_b0);
    this->isInvalid = true;
  }
  else {
    this->producingCommand = pCVar2;
    local_88 = llbuild::buildsystem::Command::getName(this->producingCommand);
    name.Length = (size_t)pCVar2;
    name.Data = (char *)local_88.Length;
    llbuild::buildsystem::BuildKey::makeCommand(&local_78,(BuildKey *)local_88.Data,name);
    llbuild::buildsystem::BuildKey::toData(&local_58,&local_78);
    llbuild::core::TaskInterface::request((TaskInterface *)&this_local,&local_58,0);
    llbuild::core::KeyType::~KeyType(&local_58);
    llbuild::buildsystem::BuildKey::~BuildKey(&local_78);
  }
  return;
}

Assistant:

virtual void start(TaskInterface ti) override {
    // Request the producer command.
    auto getCommand = [&]()->Command* {
      if (node.getProducers().size() == 1) {
        return node.getProducers()[0];
      }
      // Give the delegate a chance to resolve to a single command.
      return getBuildSystem(ti).getDelegate().
          chooseCommandFromMultipleProducers(&node, node.getProducers());
    };

    if (Command* foundCommand = getCommand()) {
      producingCommand = foundCommand;
      ti.request(BuildKey::makeCommand(producingCommand->getName()).toData(),
                 /*InputID=*/0);
      return;
    }

    // Notify that we could not resolve to a single producer.
    getBuildSystem(ti).getDelegate().
        cannotBuildNodeDueToMultipleProducers(&node, node.getProducers());
    isInvalid = true;
  }